

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

string * stringformat<int,int>(string *__return_storage_ptr__,char *fmt,int *args,int *args_1)

{
  StringFormatter<int,_int> local_1c0;
  stringstream local_1b0 [8];
  stringstream buf;
  ostream local_1a0 [376];
  int *local_28;
  int *args_local_1;
  int *args_local;
  char *fmt_local;
  
  local_28 = args_1;
  args_local_1 = args;
  args_local = (int *)fmt;
  fmt_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  StringFormatter<int,_int>::StringFormatter(&local_1c0,(char *)args_local,args_local_1,local_28);
  operator<<(local_1a0,&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}